

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

void __thiscall
slang::ast::BinaryAssertionExpr::requireSequence
          (BinaryAssertionExpr *this,ASTContext *context,DiagCode code)

{
  BinaryAssertionOperator BVar1;
  SyntaxNode *this_00;
  logic_error *this_01;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  SourceRange sourceRange;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BVar1 = this->op;
  if (BVar1 - Iff < 10) {
    this_00 = (this->super_AssertionExpr).syntax;
    if (this_00 != (SyntaxNode *)0x0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00);
      ASTContext::addDiag(context,code,sourceRange);
      return;
    }
    assert::assertFailed
              ("syntax",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
               ,0x3ab,
               "void slang::ast::BinaryAssertionExpr::requireSequence(const ASTContext &, DiagCode) const"
              );
  }
  if (BVar1 - Intersect < 3) {
    return;
  }
  if (BVar1 < Intersect) {
    AssertionExpr::requireSequence(this->left,context,code);
    AssertionExpr::requireSequence(this->right,context,code);
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
             ,"");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_90);
  local_d0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar3;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x3af);
  std::operator+(&local_50,&local_d0,&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_b0 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f0 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_f0 == plVar4) {
    local_e0 = *plVar4;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar4;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::logic_error::logic_error(this_01,(string *)&local_f0);
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void BinaryAssertionExpr::requireSequence(const ASTContext& context, DiagCode code) const {
    switch (op) {
        case BinaryAssertionOperator::And:
        case BinaryAssertionOperator::Or:
            left.requireSequence(context, code);
            right.requireSequence(context, code);
            return;
        case BinaryAssertionOperator::Intersect:
        case BinaryAssertionOperator::Throughout:
        case BinaryAssertionOperator::Within:
            return;
        case BinaryAssertionOperator::Iff:
        case BinaryAssertionOperator::Until:
        case BinaryAssertionOperator::SUntil:
        case BinaryAssertionOperator::UntilWith:
        case BinaryAssertionOperator::SUntilWith:
        case BinaryAssertionOperator::Implies:
        case BinaryAssertionOperator::OverlappedImplication:
        case BinaryAssertionOperator::NonOverlappedImplication:
        case BinaryAssertionOperator::OverlappedFollowedBy:
        case BinaryAssertionOperator::NonOverlappedFollowedBy:
            ASSERT(syntax);
            context.addDiag(code, syntax->sourceRange());
            return;
    }
    ASSUME_UNREACHABLE;
}